

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     outer_product_selector_run<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>,_1,1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>,1,_1,false>,Eigen::internal::generic_product_impl<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>,_1,1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>,1,_1,false>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
               (Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                *dst,Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>
                     *lhs,
               Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>
               *rhs,sub *func,false_type *param_5)

{
  CoeffReturnType scalar;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>
  local_230;
  ColXpr local_1a0;
  long local_138;
  Index j;
  Index cols;
  ObjectType actual_lhs;
  undefined1 local_b0 [8];
  local_nested_eval_wrapper<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,__1,_false>
  actual_lhs_wrapper;
  evaluator<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>_>
  rhsEval;
  false_type *param_4_local;
  sub *func_local;
  Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>
  *rhs_local;
  Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>
  *lhs_local;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
  *dst_local;
  
  evaluator<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>,_1,_-1,_false>_>
  ::evaluator((evaluator<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>_>
               *)&actual_lhs_wrapper.object.
                  super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
                  .m_outerStride,rhs);
  local_nested_eval_wrapper<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_-1,_1,_false>,_-1,_false>
  ::local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,__1,_false>
              *)local_b0,lhs,(Scalar *)0x0);
  memcpy(&cols,local_b0,0x68);
  j = MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>,_0>
      ::cols((MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
              *)dst);
  for (local_138 = 0; local_138 < j; local_138 = local_138 + 1) {
    DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>
    ::col(&local_1a0,
          (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>
           *)dst,local_138);
    scalar = mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>,_1,_-1,_false>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
             ::coeff((mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                      *)&actual_lhs_wrapper.object.
                         super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
                         .m_outerStride,0,local_138);
    Eigen::operator*(&local_230,scalar,(StorageBaseType *)&cols);
    generic_product_impl<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>,-1,1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,1,-1,false>,1,-1,false>,Eigen::DenseShape,Eigen::DenseShape,5>
    ::sub::operator()(func,&local_1a0,&local_230);
  }
  evaluator<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>,_1,_-1,_false>_>
  ::~evaluator((evaluator<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>_>
                *)&actual_lhs_wrapper.object.
                   super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
                   .m_outerStride);
  return;
}

Assistant:

void EIGEN_DEVICE_FUNC outer_product_selector_run(Dst& dst, const Lhs &lhs, const Rhs &rhs, const Func& func, const false_type&)
{
  evaluator<Rhs> rhsEval(rhs);
  ei_declare_local_nested_eval(Lhs,lhs,Rhs::SizeAtCompileTime,actual_lhs);
  // FIXME if cols is large enough, then it might be useful to make sure that lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dst.cols();
  for (Index j=0; j<cols; ++j)
    func(dst.col(j), rhsEval.coeff(Index(0),j) * actual_lhs);
}